

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O3

char32_t anon_unknown.dwarf_186940::decodeUtf8Character(string *source,size_t *index)

{
  char32_t cVar1;
  size_t sVar2;
  long lVar3;
  
  sVar2 = *index;
  *index = sVar2 + 1;
  cVar1 = (char32_t)*(char *)((long)&(source->_M_dataplus)._M_p + sVar2);
  if ((cVar1 & 0xe0U) == 0xc0) {
    cVar1 = cVar1 & 0x1f;
    lVar3 = 1;
  }
  else {
    if ((cVar1 & 0xf0U) != 0xe0) {
      return cVar1;
    }
    cVar1 = cVar1 & 0xf;
    lVar3 = 2;
  }
  sVar2 = sVar2 + 2;
  do {
    *index = sVar2;
    cVar1 = *(byte *)((long)source + (sVar2 - 1)) & 0x3f | cVar1 << 6;
    sVar2 = sVar2 + 1;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  return cVar1;
}

Assistant:

char32_t decodeUtf8Character(const std::string &source, size_t &index)
	{
		size_t extraBytes = 0;
		int value = source[index++];

		if ((value & 0xE0) == 0xC0)
		{
			extraBytes = 1;
			value &= 0x1F;
		} else if ((value & 0xF0) == 0xE0)
		{
			extraBytes = 2;
			value &= 0x0F;
		}

		for (size_t i = 0; i < extraBytes; i++)
		{
			int b = source[index++];
			value = (value << 6) | (b & 0x3F);
		}

		return char32_t(value);
	}